

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t best_effort_strncat_to_utf16
                  (archive_string *as16,void *_p,size_t length,archive_string_conv *sc,
                  wchar_t bigendian)

{
  uint uVar1;
  archive_string *paVar2;
  archive_string *in_RDX;
  char *in_RSI;
  long *in_RDI;
  int in_R8D;
  uint c;
  wchar_t ret;
  size_t remaining;
  char *utf16;
  char *s;
  uint in_stack_ffffffffffffffb0;
  void *local_40;
  char *local_38;
  wchar_t local_4;
  
  local_4 = L'\0';
  paVar2 = archive_string_ensure(in_RDX,(ulong)in_stack_ffffffffffffffb0);
  if (paVar2 == (archive_string *)0x0) {
    local_4 = L'\xffffffff';
  }
  else {
    local_40 = (void *)(*in_RDI + in_RDI[1]);
    local_38 = in_RSI;
    while (paVar2 = (archive_string *)((long)&in_RDX[-1].buffer_length + 7),
          in_RDX != (archive_string *)0x0) {
      uVar1 = (uint)*local_38;
      if (0x7f < uVar1) {
        uVar1 = 0xfffd;
        local_4 = L'\xffffffff';
      }
      if (in_R8D == 0) {
        archive_le16enc(local_40,(uint16_t)uVar1);
      }
      else {
        archive_be16enc(local_40,(uint16_t)uVar1);
      }
      local_40 = (void *)((long)local_40 + 2);
      in_RDX = paVar2;
      local_38 = local_38 + 1;
    }
    in_RDI[1] = (long)local_40 - *in_RDI;
    *(undefined1 *)(*in_RDI + in_RDI[1]) = 0;
    *(undefined1 *)(*in_RDI + 1 + in_RDI[1]) = 0;
  }
  return local_4;
}

Assistant:

static int
best_effort_strncat_to_utf16(struct archive_string *as16, const void *_p,
    size_t length, struct archive_string_conv *sc, int bigendian)
{
	const char *s = (const char *)_p;
	char *utf16;
	size_t remaining;
	int ret;

	(void)sc; /* UNUSED */
	/*
	 * Other case, we should do the best effort.
	 * If all character are ASCII(<0x7f), we can convert it.
	 * if not , we set a alternative character and return -1.
	 */
	ret = 0;
	remaining = length;

	if (archive_string_ensure(as16,
	    as16->length + (length + 1) * 2) == NULL)
		return (-1);

	utf16 = as16->s + as16->length;
	while (remaining--) {
		unsigned c = *s++;
		if (c > 127) {
			/* We cannot handle it. */
			c = UNICODE_R_CHAR;
			ret = -1;
		}
		if (bigendian)
			archive_be16enc(utf16, c);
		else
			archive_le16enc(utf16, c);
		utf16 += 2;
	}
	as16->length = utf16 - as16->s;
	as16->s[as16->length] = 0;
	as16->s[as16->length+1] = 0;
	return (ret);
}